

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

string * __thiscall
cmTarget::ImportedGetFullPath
          (string *__return_storage_ptr__,cmTarget *this,string *config,ArtifactType artifact)

{
  cmMakefile *pcVar1;
  bool bVar2;
  PolicyStatus PVar3;
  cmValue cVar4;
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var5;
  PolicyID id;
  cmAlphaNum *this_00;
  ArtifactType artifact_local;
  string impProp;
  cmAlphaNum local_108;
  cmValue imp;
  cmValue loc;
  string suffix;
  anon_class_24_3_c8775dd5 message;
  cmAlphaNum local_90;
  string desired_config;
  string local_40;
  
  artifact_local = artifact;
  if (((this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->IsImportedTarget == false) {
    __assert_fail("this->IsImported()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmTarget.cxx"
                  ,0x9fc,
                  "std::string cmTarget::ImportedGetFullPath(const std::string &, cmStateEnums::ArtifactType) const"
                 );
  }
  std::__cxx11::string::string((string *)&desired_config,(string *)config);
  if (config->_M_string_length == 0) {
    std::__cxx11::string::assign((char *)&desired_config);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  loc.Value = (string *)0x0;
  imp.Value = (string *)0x0;
  suffix._M_dataplus._M_p = (pointer)&suffix.field_2;
  suffix._M_string_length = 0;
  suffix.field_2._M_local_buf[0] = '\0';
  if (((this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType == 7)
  goto LAB_00283093;
  bVar2 = GetMappedConfig(this,&desired_config,&loc,&imp,&suffix);
  if (!bVar2) goto LAB_00283093;
  if (artifact_local == RuntimeBinaryArtifact) {
    if (loc.Value != (string *)0x0) {
LAB_00282f98:
      std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
      goto LAB_00283093;
    }
    local_108.View_._M_len = (size_t)&DAT_00000011;
    local_108.View_._M_str = "IMPORTED_LOCATION";
    local_90.View_._M_len = suffix._M_string_length;
    local_90.View_._M_str = suffix._M_dataplus._M_p;
    cmStrCat<>(&impProp,&local_108,&local_90);
    cVar4 = GetProperty(this,&impProp);
    if (cVar4.Value == (string *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"IMPORTED_LOCATION",(allocator<char> *)&local_90);
      cVar4 = GetProperty(this,(string *)&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      if (cVar4.Value != (string *)0x0) {
        std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    }
  }
  else {
    if (artifact_local != ImportLibraryArtifact) goto LAB_00283093;
    if (imp.Value != (string *)0x0) goto LAB_00282f98;
    if (((this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType != 2) {
      bVar2 = IsExecutableWithExports(this);
      if (!bVar2) goto LAB_00283093;
    }
    local_108.View_._M_len = 0xf;
    local_108.View_._M_str = "IMPORTED_IMPLIB";
    local_90.View_._M_len = suffix._M_string_length;
    local_90.View_._M_str = suffix._M_dataplus._M_p;
    cmStrCat<>(&impProp,&local_108,&local_90);
    cVar4 = GetProperty(this,&impProp);
    if (cVar4.Value == (string *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"IMPORTED_IMPLIB",(allocator<char> *)&local_90);
      cVar4 = GetProperty(this,(string *)&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      if (cVar4.Value != (string *)0x0) {
        std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    }
  }
  std::__cxx11::string::~string((string *)&impProp);
LAB_00283093:
  if (__return_storage_ptr__->_M_string_length == 0) {
    _Var5._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
    if ((_Var5._M_head_impl)->TargetType != 7) {
      message.artifact = &artifact_local;
      message.config = config;
      message.this = this;
      PVar3 = GetPolicyStatus(this,CMP0111);
      if (PVar3 != OLD) {
        if (PVar3 == WARN) {
          pcVar1 = ((this->impl)._M_t.
                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
          cmPolicies::GetPolicyWarning_abi_cxx11_(&impProp,(cmPolicies *)0x6f,id);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_90,&impProp,"\n");
          ImportedGetFullPath(std::__cxx11::string_const&,cmStateEnums::ArtifactType)::
          operator()[abi_cxx11_(&local_40,&message);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_108,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_90,&local_40);
          cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,(string *)&local_108);
          std::__cxx11::string::~string((string *)&local_108);
          std::__cxx11::string::~string((string *)&local_40);
          std::__cxx11::string::~string((string *)&local_90);
          this_00 = (cmAlphaNum *)&impProp;
        }
        else {
          pcVar1 = ((this->impl)._M_t.
                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
          ImportedGetFullPath(std::__cxx11::string_const&,cmStateEnums::ArtifactType)::
          operator()[abi_cxx11_((string *)&local_108,&message);
          cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)&local_108);
          this_00 = &local_108;
        }
        std::__cxx11::string::~string((string *)this_00);
      }
      _Var5._M_head_impl =
           (this->impl)._M_t.
           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
           super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
    }
    local_108.View_._M_str = ((_Var5._M_head_impl)->Name)._M_dataplus._M_p;
    local_108.View_._M_len = ((_Var5._M_head_impl)->Name)._M_string_length;
    local_90.View_._M_len = (size_t)&DAT_00000009;
    local_90.View_._M_str = "-NOTFOUND";
    cmStrCat<>(&impProp,&local_108,&local_90);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&impProp);
    std::__cxx11::string::~string((string *)&impProp);
  }
  std::__cxx11::string::~string((string *)&suffix);
  std::__cxx11::string::~string((string *)&desired_config);
  return __return_storage_ptr__;
}

Assistant:

std::string cmTarget::ImportedGetFullPath(
  const std::string& config, cmStateEnums::ArtifactType artifact) const
{
  assert(this->IsImported());

  // Lookup/compute/cache the import information for this
  // configuration.
  std::string desired_config = config;
  if (config.empty()) {
    desired_config = "NOCONFIG";
  }

  std::string result;

  cmValue loc = nullptr;
  cmValue imp = nullptr;
  std::string suffix;

  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      this->GetMappedConfig(desired_config, loc, imp, suffix)) {
    switch (artifact) {
      case cmStateEnums::RuntimeBinaryArtifact:
        if (loc) {
          result = *loc;
        } else {
          std::string impProp = cmStrCat("IMPORTED_LOCATION", suffix);
          if (cmValue config_location = this->GetProperty(impProp)) {
            result = *config_location;
          } else if (cmValue location =
                       this->GetProperty("IMPORTED_LOCATION")) {
            result = *location;
          }
        }
        break;

      case cmStateEnums::ImportLibraryArtifact:
        if (imp) {
          result = *imp;
        } else if (this->GetType() == cmStateEnums::SHARED_LIBRARY ||
                   this->IsExecutableWithExports()) {
          std::string impProp = cmStrCat("IMPORTED_IMPLIB", suffix);
          if (cmValue config_implib = this->GetProperty(impProp)) {
            result = *config_implib;
          } else if (cmValue implib = this->GetProperty("IMPORTED_IMPLIB")) {
            result = *implib;
          }
        }
        break;
    }
  }

  if (result.empty()) {
    if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY) {
      auto message = [&]() -> std::string {
        std::string unset;
        std::string configuration;

        if (artifact == cmStateEnums::RuntimeBinaryArtifact) {
          unset = "IMPORTED_LOCATION";
        } else if (artifact == cmStateEnums::ImportLibraryArtifact) {
          unset = "IMPORTED_IMPLIB";
        }

        if (!config.empty()) {
          configuration = cmStrCat(" configuration \"", config, "\"");
        }

        return cmStrCat(unset, " not set for imported target \"",
                        this->GetName(), "\"", configuration, ".");
      };

      switch (this->GetPolicyStatus(cmPolicies::CMP0111)) {
        case cmPolicies::WARN:
          this->impl->Makefile->IssueMessage(
            MessageType::AUTHOR_WARNING,
            cmPolicies::GetPolicyWarning(cmPolicies::CMP0111) + "\n" +
              message());
          CM_FALLTHROUGH;
        case cmPolicies::OLD:
          break;
        default:
          this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                             message());
      }
    }

    result = cmStrCat(this->GetName(), "-NOTFOUND");
  }
  return result;
}